

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TgSymGroupPerm(Abc_TgMan_t *pMan,int idx,int fSwapOnly)

{
  word *pIn1;
  int iVar1;
  int iVar2;
  undefined1 local_1b0 [8];
  Abc_TgMan_t tgManBest;
  Abc_TgMan_t tgManCopy;
  int nWords;
  int Config;
  word *pTruth;
  int fSwapOnly_local;
  int idx_local;
  Abc_TgMan_t *pMan_local;
  
  pIn1 = pMan->pTruth;
  iVar1 = Abc_TtWordNum(pMan->nVars);
  CheckConfig(pMan);
  if (fSwapOnly == 0) {
    Abc_TgManCopy((Abc_TgMan_t *)&tgManBest.vPhase,Abc_TgSymGroupPerm::pCopy,pMan);
    Abc_TgManCopy((Abc_TgMan_t *)local_1b0,Abc_TgSymGroupPerm::pBest,pMan);
    Abc_TgFlipSymGroup((Abc_TgMan_t *)&tgManBest.vPhase,idx);
    CheckConfig((Abc_TgMan_t *)&tgManBest.vPhase);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy((Abc_TgMan_t *)local_1b0,Abc_TgSymGroupPerm::pBest,
                    (Abc_TgMan_t *)&tgManBest.vPhase);
    }
    tgManCopy.vPhase._5_3_ = 0;
    tgManCopy.vPhase._4_1_ = iVar2 == 1;
    Abc_TgFlipSymGroup((Abc_TgMan_t *)&tgManBest.vPhase,idx + 1);
    CheckConfig((Abc_TgMan_t *)&tgManBest.vPhase);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy((Abc_TgMan_t *)local_1b0,Abc_TgSymGroupPerm::pBest,
                    (Abc_TgMan_t *)&tgManBest.vPhase);
      tgManCopy.vPhase._4_4_ = 3;
    }
    Abc_TgFlipSymGroup((Abc_TgMan_t *)&tgManBest.vPhase,idx);
    CheckConfig((Abc_TgMan_t *)&tgManBest.vPhase);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy((Abc_TgMan_t *)local_1b0,Abc_TgSymGroupPerm::pBest,
                    (Abc_TgMan_t *)&tgManBest.vPhase);
      tgManCopy.vPhase._4_4_ = 2;
    }
    Abc_TgSwapAdjacentSymGroups((Abc_TgMan_t *)&tgManBest.vPhase,idx);
    CheckConfig((Abc_TgMan_t *)&tgManBest.vPhase);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy((Abc_TgMan_t *)local_1b0,Abc_TgSymGroupPerm::pBest,
                    (Abc_TgMan_t *)&tgManBest.vPhase);
      tgManCopy.vPhase._4_4_ = 6;
    }
    Abc_TgFlipSymGroup((Abc_TgMan_t *)&tgManBest.vPhase,idx + 1);
    CheckConfig((Abc_TgMan_t *)&tgManBest.vPhase);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy((Abc_TgMan_t *)local_1b0,Abc_TgSymGroupPerm::pBest,
                    (Abc_TgMan_t *)&tgManBest.vPhase);
      tgManCopy.vPhase._4_4_ = 7;
    }
    Abc_TgFlipSymGroup((Abc_TgMan_t *)&tgManBest.vPhase,idx);
    CheckConfig((Abc_TgMan_t *)&tgManBest.vPhase);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy((Abc_TgMan_t *)local_1b0,Abc_TgSymGroupPerm::pBest,
                    (Abc_TgMan_t *)&tgManBest.vPhase);
      tgManCopy.vPhase._4_4_ = 5;
    }
    Abc_TgFlipSymGroup((Abc_TgMan_t *)&tgManBest.vPhase,idx + 1);
    CheckConfig((Abc_TgMan_t *)&tgManBest.vPhase);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy((Abc_TgMan_t *)local_1b0,Abc_TgSymGroupPerm::pBest,
                    (Abc_TgMan_t *)&tgManBest.vPhase);
      tgManCopy.vPhase._4_4_ = 4;
    }
    Abc_TgSwapAdjacentSymGroups((Abc_TgMan_t *)&tgManBest.vPhase,idx);
    CheckConfig((Abc_TgMan_t *)&tgManBest.vPhase);
    iVar2 = Abc_TtEqual(pIn1,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 0) {
      __assert_fail("Abc_TtEqual(pTruth, pCopy, nWords)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x846,"int Abc_TgSymGroupPerm(Abc_TgMan_t *, int, int)");
    }
    if (tgManCopy.vPhase._4_4_ == 0) {
      pMan_local._4_4_ = 0;
    }
    else {
      iVar1 = Abc_TtCompareRev(pIn1,Abc_TgSymGroupPerm::pBest,iVar1);
      if (iVar1 != 1) {
        __assert_fail("Abc_TtCompareRev(pTruth, pBest, nWords) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                      ,0x849,"int Abc_TgSymGroupPerm(Abc_TgMan_t *, int, int)");
      }
      Abc_TgManCopy(pMan,pIn1,(Abc_TgMan_t *)local_1b0);
      pMan_local._4_4_ = tgManCopy.vPhase._4_4_;
    }
  }
  else {
    Abc_TgManCopy((Abc_TgMan_t *)&tgManBest.vPhase,Abc_TgSymGroupPerm::pCopy,pMan);
    Abc_TgSwapAdjacentSymGroups((Abc_TgMan_t *)&tgManBest.vPhase,idx);
    CheckConfig((Abc_TgMan_t *)&tgManBest.vPhase);
    iVar1 = Abc_TtCompareRev(pIn1,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar1 < 0) {
      Abc_TgManCopy(pMan,pIn1,(Abc_TgMan_t *)&tgManBest.vPhase);
      pMan_local._4_4_ = 4;
    }
    else {
      pMan_local._4_4_ = 0;
    }
  }
  return pMan_local._4_4_;
}

Assistant:

static int Abc_TgSymGroupPerm(Abc_TgMan_t* pMan, int idx, int fSwapOnly)
{
    word* pTruth = pMan->pTruth;
    static word pCopy[1024];
    static word pBest[1024];
    int Config = 0;
    int nWords = Abc_TtWordNum(pMan->nVars);
    Abc_TgMan_t tgManCopy, tgManBest;

    CheckConfig(pMan);
    if (fSwapOnly)
    {
        Abc_TgManCopy(&tgManCopy, pCopy, pMan);
        Abc_TgSwapAdjacentSymGroups(&tgManCopy, idx);
        CheckConfig(&tgManCopy);
        if (Abc_TtCompareRev(pTruth, pCopy, nWords) < 0)
        {
            Abc_TgManCopy(pMan, pTruth, &tgManCopy);
            return 4;
        }
        return 0;
    }

    // save two copies
    Abc_TgManCopy(&tgManCopy, pCopy, pMan);
    Abc_TgManCopy(&tgManBest, pBest, pMan);
    // PXY
    // 001
    Abc_TgFlipSymGroup(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 1;
    // PXY
    // 011
    Abc_TgFlipSymGroup(&tgManCopy, idx + 1);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 3;
    // PXY
    // 010
    Abc_TgFlipSymGroup(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 2;
    // PXY
    // 110
    Abc_TgSwapAdjacentSymGroups(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 6;
    // PXY
    // 111
    Abc_TgFlipSymGroup(&tgManCopy, idx + 1);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 7;
    // PXY
    // 101
    Abc_TgFlipSymGroup(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 5;
    // PXY
    // 100
    Abc_TgFlipSymGroup(&tgManCopy, idx + 1);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 4;
    // PXY
    // 000
    Abc_TgSwapAdjacentSymGroups(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    assert(Abc_TtEqual(pTruth, pCopy, nWords));
    if (Config == 0)
        return 0;
    assert(Abc_TtCompareRev(pTruth, pBest, nWords) == 1);
    Abc_TgManCopy(pMan, pTruth, &tgManBest);
    return Config;
}